

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_blocks
          (crn_comp *this,uint group,bool clear_histograms,symbol_codec *pCodec,
          vector<unsigned_short> *pColor_endpoint_remap,
          vector<unsigned_short> *pColor_selector_remap,
          vector<unsigned_short> *pAlpha_endpoint_remap,
          vector<unsigned_short> *pAlpha_selector_remap)

{
  uint *puVar1;
  bool bVar2;
  uint8 uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  level_details *plVar8;
  endpoint_indices_details *peVar9;
  long *plVar10;
  uint8 uVar11;
  symbol_histogram *psVar12;
  undefined1 *puVar13;
  byte bVar14;
  uint c;
  uint uVar15;
  long lVar16;
  vector<unsigned_short> *pvVar17;
  uint uVar18;
  uint uVar19;
  uint sym;
  int iVar20;
  ulong uVar21;
  uint endpoint_index [3];
  vector<unsigned_short> *selector_remap [3];
  vector<unsigned_short> *endpoint_remap [3];
  uint local_98 [4];
  static_huffman_data_model *local_88;
  symbol_histogram *local_80;
  undefined1 *local_78;
  ulong local_70;
  long local_68 [4];
  long local_48 [3];
  
  if (pCodec == (symbol_codec *)0x0) {
    symbol_histogram::resize(&this->m_reference_hist,0x100);
    if (clear_histograms) {
      symbol_histogram::set_all(&this->m_reference_hist,0);
    }
    if (pColor_endpoint_remap != (vector<unsigned_short> *)0x0) {
      symbol_histogram::resize(this->m_endpoint_index_hist,pColor_endpoint_remap->m_size);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_endpoint_index_hist,0);
      }
    }
    if (pColor_selector_remap != (vector<unsigned_short> *)0x0) {
      symbol_histogram::resize(this->m_selector_index_hist,pColor_selector_remap->m_size);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_selector_index_hist,0);
      }
    }
    if (pAlpha_endpoint_remap != (vector<unsigned_short> *)0x0) {
      symbol_histogram::resize(this->m_endpoint_index_hist + 1,pAlpha_endpoint_remap->m_size);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_endpoint_index_hist + 1,0);
      }
    }
    if (pAlpha_selector_remap != (vector<unsigned_short> *)0x0) {
      symbol_histogram::resize(this->m_selector_index_hist + 1,pAlpha_selector_remap->m_size);
      if (clear_histograms) {
        symbol_histogram::set_all(this->m_selector_index_hist + 1,0);
      }
    }
  }
  local_98[2] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
    if (this->m_has_comp[lVar16] == true) {
      pvVar17 = pAlpha_endpoint_remap;
      if (lVar16 == 0) {
        pvVar17 = pColor_endpoint_remap;
      }
      local_48[lVar16] = (long)pvVar17;
      pvVar17 = pAlpha_selector_remap;
      if (lVar16 == 0) {
        pvVar17 = pColor_selector_remap;
      }
      local_68[lVar16] = (long)pvVar17;
    }
  }
  plVar8 = (this->m_levels).m_p;
  uVar5 = plVar8[group].first_block;
  uVar21 = (ulong)uVar5;
  uVar6 = plVar8[group].block_width;
  uVar7 = plVar8[group].num_blocks;
  local_88 = &this->m_reference_dm;
  local_78 = &this->field_0x1fc0;
  local_80 = this->m_selector_index_hist;
  uVar15 = 0;
  while ((uint)uVar21 < uVar7 + uVar5) {
    for (uVar19 = 0; uVar19 != uVar6; uVar19 = uVar19 + 1) {
      bVar2 = this->m_has_subblocks;
      iVar20 = (int)uVar21;
      local_70 = uVar21;
      if (((uVar19 | uVar15) & 1) == 0) {
        peVar9 = (this->m_endpoint_indices).m_p;
        bVar14 = peVar9[uVar6 + iVar20 + 1].reference << 6 | peVar9[iVar20 + 1].reference << 4 |
                 peVar9[iVar20 + uVar6].reference << 2 | peVar9[uVar21].reference;
        if (pCodec == (symbol_codec *)0x0) {
          puVar1 = (this->m_reference_hist).m_hist.m_p + bVar14;
          *puVar1 = *puVar1 + 1;
        }
        else {
          symbol_codec::encode(pCodec,(uint)bVar14,local_88);
        }
      }
      bVar14 = bVar2 & (byte)uVar19;
      for (lVar16 = 0; puVar13 = local_78, psVar12 = local_80,
          (ulong)((byte)~bVar14 & 1) * 2 + 1 != lVar16; lVar16 = lVar16 + 1) {
        plVar10 = (long *)local_48[lVar16];
        if (plVar10 != (long *)0x0) {
          peVar9 = (this->m_endpoint_indices).m_p;
          uVar18 = (uint)*(ushort *)(*plVar10 + (ulong)peVar9[uVar21].field_0.component[lVar16] * 2)
          ;
          uVar3 = peVar9[uVar21].reference;
          uVar11 = uVar3 == '\0';
          if ((bVar14 & 1) != 0) {
            uVar11 = uVar3;
          }
          if (uVar11 != '\0') {
            sym = uVar18 - local_98[lVar16];
            if ((int)sym < 0) {
              sym = sym + (int)plVar10[1];
            }
            if (pCodec == (symbol_codec *)0x0) {
              puVar1 = this->m_endpoint_index_hist[lVar16 != 0].m_hist.m_p + sym;
              *puVar1 = *puVar1 + 1;
            }
            else {
              symbol_codec::encode
                        (pCodec,sym,
                         (static_huffman_data_model *)
                         ((long)this->m_endpoint_index_hist + (ulong)(lVar16 != 0) * 0x38 + 0x20));
            }
          }
          local_98[lVar16] = uVar18;
        }
      }
      if ((bVar14 & 1) == 0) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          if ((long *)local_68[lVar16] != (long *)0x0) {
            uVar4 = *(ushort *)
                     (*(long *)local_68[lVar16] +
                     (ulong)(this->m_selector_indices).m_p[uVar21].field_0.component[lVar16] * 2);
            if (pCodec == (symbol_codec *)0x0) {
              puVar1 = psVar12[lVar16 != 0].m_hist.m_p + uVar4;
              *puVar1 = *puVar1 + 1;
            }
            else {
              symbol_codec::encode
                        (pCodec,(uint)uVar4,
                         (static_huffman_data_model *)(puVar13 + (ulong)(lVar16 != 0) * 0x38));
            }
          }
        }
      }
      uVar21 = (ulong)((int)local_70 + 1);
    }
    uVar15 = uVar15 + 1;
  }
  return true;
}

Assistant:

bool crn_comp::pack_blocks(
        uint group,
        bool clear_histograms,
        symbol_codec* pCodec,
        const crnlib::vector<uint16>* pColor_endpoint_remap,
        const crnlib::vector<uint16>* pColor_selector_remap,
        const crnlib::vector<uint16>* pAlpha_endpoint_remap,
        const crnlib::vector<uint16>* pAlpha_selector_remap)
    {
        if (!pCodec)
        {
            m_reference_hist.resize(256);
            if (clear_histograms)
            {
                m_reference_hist.set_all(0);
            }

            if (pColor_endpoint_remap)
            {
                m_endpoint_index_hist[0].resize(pColor_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[0].set_all(0);
                }
            }

            if (pColor_selector_remap)
            {
                m_selector_index_hist[0].resize(pColor_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[0].set_all(0);
                }
            }

            if (pAlpha_endpoint_remap)
            {
                m_endpoint_index_hist[1].resize(pAlpha_endpoint_remap->size());
                if (clear_histograms)
                {
                    m_endpoint_index_hist[1].set_all(0);
                }
            }

            if (pAlpha_selector_remap)
            {
                m_selector_index_hist[1].resize(pAlpha_selector_remap->size());
                if (clear_histograms)
                {
                    m_selector_index_hist[1].set_all(0);
                }
            }
        }

        uint endpoint_index[cNumComps] = {};
        const crnlib::vector<uint16>* endpoint_remap[cNumComps] = {};
        const crnlib::vector<uint16>* selector_remap[cNumComps] = {};
        for (uint c = 0; c < cNumComps; c++)
        {
            if (m_has_comp[c])
            {
                endpoint_remap[c] = c ? pAlpha_endpoint_remap : pColor_endpoint_remap;
                selector_remap[c] = c ? pAlpha_selector_remap : pColor_selector_remap;
            }
        }

        uint block_width = m_levels[group].block_width;
        for (uint by = 0, b = m_levels[group].first_block, bEnd = b + m_levels[group].num_blocks; b < bEnd; by++)
        {
            for (uint bx = 0; bx < block_width; bx++, b++)
            {
                const bool secondary_etc_subblock = m_has_subblocks && bx & 1;
                if (!(by & 1) && !(bx & 1))
                {
                    uint8 reference_group = m_endpoint_indices[b].reference | m_endpoint_indices[b + block_width].reference << 2 |
                        m_endpoint_indices[b + 1].reference << 4 | m_endpoint_indices[b + block_width + 1].reference << 6;
                    if (pCodec)
                    {
                        pCodec->encode(reference_group, m_reference_dm);
                    }
                    else
                    {
                        m_reference_hist.inc_freq(reference_group);
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? cAlpha0 : cNumComps; c < cEnd; c++)
                {
                    if (endpoint_remap[c])
                    {
                        uint index = (*endpoint_remap[c])[m_endpoint_indices[b].component[c]];
                        if (secondary_etc_subblock ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference)
                        {
                            int sym = index - endpoint_index[c];
                            if (sym < 0)
                            {
                                sym += endpoint_remap[c]->size();
                            }
                            if (!pCodec)
                            {
                                m_endpoint_index_hist[c ? 1 : 0].inc_freq(sym);
                            }
                            else
                            {
                                pCodec->encode(sym, m_endpoint_index_dm[c ? 1 : 0]);
                            }
                        }
                        endpoint_index[c] = index;
                    }
                }
                for (uint c = 0, cEnd = secondary_etc_subblock ? 0 : cNumComps; c < cEnd; c++)
                {
                    if (selector_remap[c])
                    {
                        uint index = (*selector_remap[c])[m_selector_indices[b].component[c]];
                        if (!pCodec)
                        {
                            m_selector_index_hist[c ? 1 : 0].inc_freq(index);
                        }
                        else
                        {
                            pCodec->encode(index, m_selector_index_dm[c ? 1 : 0]);
                        }
                    }
                }
            }
        }
        return true;
    }